

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O2

void av1_compute_global_motion_facade(AV1_COMP *cpi)

{
  GlobalMotionData *pGVar1;
  int32_t *piVar2;
  _Bool _Var3;
  GM_SEARCH_TYPE GVar4;
  char cVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  AV1_PRIMARY *pAVar7;
  RefCntBuffer *pRVar8;
  aom_internal_error_info *error_info;
  uint uVar9;
  GlobalMotionData *pGVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint8_t *puVar15;
  int *piVar16;
  FrameDistPair (*paFVar17) [7];
  uint uVar18;
  int i;
  RefCntBuffer *pRVar19;
  AV1_COMP *pAVar20;
  bool bVar21;
  uint uVar22;
  byte bVar24;
  int frame;
  long lVar25;
  uint *ref_display_order_hint;
  long lVar26;
  bool bVar27;
  MV_REFERENCE_FRAME local_7a [2];
  AV1_COMP *local_78;
  undefined8 local_70;
  MV_REFERENCE_FRAME *local_68;
  FrameDistPair (*local_60) [7];
  MotionModel *local_58;
  int ref_frame_list [2];
  MV_REFERENCE_FRAME *pMVar23;
  
  _Var3 = (cpi->oxcf).tool_cfg.enable_global_motion;
  if ((_Var3 == true) && (cpi->gf_frame_index == '\0')) {
    pAVar7 = cpi->ppi;
    for (lVar25 = 0; lVar25 != 7; lVar25 = lVar25 + 1) {
      pAVar7->valid_gm_model_found[lVar25] = 0x7fffffff;
    }
  }
  pAVar20 = cpi;
  if (((((cpi->common).current_frame.frame_type == '\x01') &&
       (pYVar6 = cpi->source, pYVar6 != (YV12_BUFFER_CONFIG *)0x0 && _Var3 == true)) &&
      ((cpi->gm_info).search_done == false)) && ((cpi->sf).gm_sf.gm_search_type != '\x04')) {
    (cpi->gm_info).segment_map_w = (pYVar6->field_2).field_0.y_crop_width + 0x1f >> 5;
    (cpi->gm_info).segment_map_h = (pYVar6->field_3).field_0.y_crop_height + 0x1f >> 5;
    (cpi->gm_info).reference_frames[0][0].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][0].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][1].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][1].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][2].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][2].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][3].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][3].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][4].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][4].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][5].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][5].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[0][6].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[0][6].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][0].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][0].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][1].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][1].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][2].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][2].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][3].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][3].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][4].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][4].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][5].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][5].frame = 0xffffffff;
    (cpi->gm_info).reference_frames[1][6].distance = -1;
    *(undefined4 *)&(cpi->gm_info).reference_frames[1][6].frame = 0xffffffff;
    (cpi->gm_info).num_ref_frames[0] = 0;
    (cpi->gm_info).num_ref_frames[1] = 0;
    pAVar7 = cpi->ppi;
    if ((cpi->sf).inter_sf.selective_ref_frame < 1) {
      bVar21 = true;
    }
    else {
      bVar24 = (pAVar7->gf_group).update_type[cpi->gf_frame_index];
      bVar21 = bVar24 == 0 || (bVar24 & 0xfe) == 2;
    }
    local_60 = (cpi->gm_info).reference_frames;
    if ((((cpi->sf).gm_sf.disable_gm_search_based_on_stats == 0) ||
        ((pAVar7->gf_group).arf_index < 0)) ||
       ((pAVar7->valid_gm_model_found[3] != 0 || (pAVar7->valid_gm_model_found[6] != 0)))) {
      local_70 = (uint8_t *)((ulong)local_70._4_4_ << 0x20);
    }
    else {
      local_70 = (uint8_t *)
                 CONCAT44(local_70._4_4_,
                          (int)CONCAT71((int7)((ulong)pAVar7 >> 8),
                                        pAVar7->valid_gm_model_found[1] == 0));
    }
    local_58 = (MotionModel *)CONCAT44(local_58._4_4_,((cpi->common).cur_frame)->pyramid_level);
    lVar25 = 0x41fe0;
    local_78 = cpi;
    for (lVar26 = 0; lVar26 != -7; lVar26 = lVar26 + -1) {
      pMVar23 = (MV_REFERENCE_FRAME *)(lVar26 + 7);
      local_7a[0] = (MV_REFERENCE_FRAME)pMVar23;
      local_7a[1] = 0xff;
      if (((byte)((char)lVar26 + 6U) < 8) &&
         (lVar14 = (long)(pAVar20->common).remapped_ref_idx[(int)lVar26 + 6], lVar14 != -1)) {
        pRVar19 = (pAVar20->common).ref_frame_map[lVar14];
      }
      else {
        pRVar19 = (RefCntBuffer *)0x0;
      }
      uVar22 = pAVar20->ref_frame_flags;
      bVar24 = ""[lVar26 + 7];
      (pAVar20->gm_info).ref_buf[lVar26 + 7] = (YV12_BUFFER_CONFIG *)0x0;
      piVar2 = (int32_t *)((long)(pAVar20->enc_quant_dequant_params).quants.y_quant[0] + lVar25);
      piVar2[0] = 0;
      piVar2[1] = 0x10000;
      *(undefined8 *)(piVar2 + 2) = 0;
      piVar2 = (int32_t *)((long)((pAVar20->enc_quant_dequant_params).quants.y_quant + -1) + lVar25)
      ;
      piVar2[0] = 0;
      piVar2[1] = 0;
      piVar2[2] = 0x10000;
      piVar2[3] = 0;
      *(undefined4 *)((long)(pAVar20->enc_quant_dequant_params).quants.y_quant[1] + lVar25) = 0;
      if ((pRVar19 != (RefCntBuffer *)0x0) &&
         (((uVar22 & bVar24) != 0 || ((pAVar20->sf).hl_sf.recode_loop == '\0')))) {
        (pAVar20->gm_info).ref_buf[lVar26 + 7] = &pRVar19->buf;
        if ((bVar21) ||
           ((iVar12 = (pAVar20->sf).inter_sf.selective_ref_frame, iVar12 == 0 || (iVar12 < 2)))) {
LAB_001b40d5:
          uVar22 = (uint)pMVar23;
          bVar24 = 0;
        }
        else {
          pRVar8 = (pAVar20->common).cur_frame;
          ref_frame_list[0] = 3;
          ref_frame_list[1] = 2;
          ref_display_order_hint = pRVar8->ref_display_order_hint;
          local_68 = pMVar23;
          iVar11 = prune_ref(local_7a,ref_display_order_hint,pRVar8->ref_display_order_hint[3],
                             ref_frame_list);
          bVar24 = 1;
          pAVar20 = local_78;
          if (iVar11 == 0) {
            pMVar23 = local_68;
            if (iVar12 != 2) {
              ref_frame_list[0] = 6;
              ref_frame_list[1] = 5;
              iVar12 = prune_ref(local_7a,ref_display_order_hint,*ref_display_order_hint,
                                 ref_frame_list);
              uVar22 = (uint)local_68;
              pAVar20 = local_78;
              pMVar23 = local_68;
              if (iVar12 != 0) goto LAB_001b40d8;
            }
            goto LAB_001b40d5;
          }
          uVar22 = (uint)local_68;
        }
LAB_001b40d8:
        if (((pRVar19->buf).field_2.field_0.y_crop_width ==
             (pAVar20->source->field_2).field_0.y_crop_width) &&
           ((pRVar19->buf).field_3.field_0.y_crop_height ==
            (pAVar20->source->field_3).field_0.y_crop_height)) {
          GVar4 = (pAVar20->sf).gm_sf.gm_search_type;
          if (GVar4 == '\x04') {
            bVar27 = false;
          }
          else if (GVar4 == '\x02') {
            bVar27 = lVar26 != -1 && (uVar22 & 0x7ffffffe) != 2;
          }
          else {
            bVar27 = true;
            if (GVar4 == '\x01') {
              bVar27 = (uVar22 & 0x7ffffffe) != 2;
            }
          }
          if ((((bVar24 | ~bVar27 | (byte)local_70) & 1) == 0 &&
               (int)pRVar19->pyramid_level <= (int)local_58) &&
             (uVar13 = pRVar19->display_order_hint -
                       ((pAVar20->common).cur_frame)->display_order_hint, uVar13 != 0)) {
            uVar18 = ~uVar13 >> 0x1f;
            paFVar17 = (cpi->gm_info).reference_frames + 1;
            if ((int)uVar13 < 0) {
              paFVar17 = local_60;
            }
            uVar9 = -uVar13;
            if (0 < (int)uVar13) {
              uVar9 = uVar13;
            }
            (*paFVar17)[(pAVar20->gm_info).num_ref_frames[uVar18]].distance = uVar9;
            iVar12 = (pAVar20->gm_info).num_ref_frames[uVar18];
            (*paFVar17)[iVar12].frame = (MV_REFERENCE_FRAME)uVar22;
            (pAVar20->gm_info).num_ref_frames[uVar18] = iVar12 + 1;
          }
        }
      }
      lVar25 = lVar25 + -0x24;
    }
    qsort(local_60,(long)(pAVar20->gm_info).num_ref_frames[0],8,compare_distance);
    qsort((local_78->gm_info).reference_frames + 1,(long)(local_78->gm_info).num_ref_frames[1],8,
          compare_distance);
    pAVar20 = local_78;
    if ((local_78->sf).gm_sf.gm_search_type == '\x03') {
      iVar11 = (local_78->gm_info).num_ref_frames[0];
      if ((local_78->gm_info).num_ref_frames[1] < 1) {
        iVar12 = 2;
        if (iVar11 < 2) {
          iVar12 = iVar11;
        }
        (local_78->gm_info).num_ref_frames[0] = iVar12;
      }
      else {
        iVar12 = 1;
        if (iVar11 < 1) {
          iVar12 = iVar11;
        }
        (local_78->gm_info).num_ref_frames[0] = iVar12;
        (local_78->gm_info).num_ref_frames[1] = 1;
      }
    }
    else {
      iVar12 = (local_78->gm_info).num_ref_frames[0];
    }
    if ((iVar12 != 0) || ((local_78->gm_info).num_ref_frames[1] != 0)) {
      pGVar1 = &(local_78->td).gm_data;
      puVar15 = (uint8_t *)
                aom_malloc((long)(local_78->gm_info).segment_map_h *
                           (long)(local_78->gm_info).segment_map_w);
      (pAVar20->td).gm_data.segment_map = puVar15;
      if (puVar15 == (uint8_t *)0x0) {
        aom_internal_error((pAVar20->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate gm_data->segment_map");
      }
      (pAVar20->td).gm_data.motion_models[0].inliers = (int *)0x0;
      (pAVar20->td).gm_data.motion_models[0].num_inliers = 0;
      *(undefined4 *)&(pAVar20->td).gm_data.motion_models[0].field_0x3c = 0;
      pGVar10 = &(pAVar20->td).gm_data;
      pGVar10->motion_models[0].params[4] = 0.0;
      pGVar10->motion_models[0].params[5] = 0.0;
      pGVar10 = &(pAVar20->td).gm_data;
      pGVar10->motion_models[0].params[2] = 0.0;
      pGVar10->motion_models[0].params[3] = 0.0;
      pGVar1->motion_models[0].params[0] = 0.0;
      pGVar1->motion_models[0].params[1] = 0.0;
      piVar16 = (int *)aom_malloc(0x8000);
      (pAVar20->td).gm_data.motion_models[0].inliers = piVar16;
      if (piVar16 == (int *)0x0) {
        aom_internal_error((pAVar20->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate gm_data->motion_models[m].inliers");
        pAVar20 = local_78;
      }
      if ((pAVar20->mt_info).num_workers < 2) {
        local_68 = &(pAVar20->gm_info).reference_frames[0][0].frame;
        paFVar17 = (FrameDistPair (*) [7])0x0;
        local_58 = pGVar1->motion_models;
        while (paFVar17 != (FrameDistPair (*) [7])0x2) {
          lVar25 = (long)(pAVar20->gm_info).num_ref_frames[(long)paFVar17];
          local_60 = paFVar17;
          if (0 < lVar25) {
            local_70 = (pAVar20->td).gm_data.segment_map;
            iVar12 = (pAVar20->gm_info).segment_map_w;
            iVar11 = (pAVar20->gm_info).segment_map_h;
            error_info = (pAVar20->td).mb.e_mbd.error_info;
            for (lVar26 = 0; lVar25 != lVar26; lVar26 = lVar26 + 1) {
              cVar5 = local_68[lVar26 * 8];
              av1_compute_gm_for_valid_ref_frames
                        (pAVar20,error_info,(cpi->gm_info).ref_buf,(int)cVar5,local_58,local_70,
                         iVar12,iVar11);
              pAVar20 = local_78;
              if (((local_78->sf).gm_sf.prune_ref_frame_for_gm_search != 0) &&
                 ((cpi->common).global_motion[(int)cVar5].wmtype < 2)) break;
            }
          }
          local_68 = local_68 + 0x38;
          paFVar17 = (FrameDistPair (*) [7])((long)&(*local_60)[0].distance + 1);
        }
      }
      else {
        av1_global_motion_estimation_mt(pAVar20);
        pAVar20 = local_78;
      }
      aom_free((pAVar20->td).gm_data.segment_map);
      (local_78->td).gm_data.segment_map = (uint8_t *)0x0;
      aom_free((local_78->td).gm_data.motion_models[0].inliers);
      (local_78->td).gm_data.motion_models[0].inliers = (int *)0x0;
      (local_78->gm_info).search_done = true;
      pAVar20 = local_78;
    }
  }
  memcpy(((pAVar20->common).cur_frame)->global_motion,(pAVar20->common).global_motion,0x120);
  return;
}

Assistant:

void av1_compute_global_motion_facade(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  GlobalMotionInfo *const gm_info = &cpi->gm_info;

  if (cpi->oxcf.tool_cfg.enable_global_motion) {
    if (cpi->gf_frame_index == 0) {
      for (int i = 0; i < FRAME_UPDATE_TYPES; i++) {
        cpi->ppi->valid_gm_model_found[i] = INT32_MAX;
#if CONFIG_FPMT_TEST
        if (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE)
          cpi->ppi->temp_valid_gm_model_found[i] = INT32_MAX;
#endif
      }
    }
  }

  if (cpi->common.current_frame.frame_type == INTER_FRAME && cpi->source &&
      cpi->oxcf.tool_cfg.enable_global_motion && !gm_info->search_done &&
      cpi->sf.gm_sf.gm_search_type != GM_DISABLE_SEARCH) {
    setup_global_motion_info_params(cpi);
    // Terminate early if the total number of reference frames is zero.
    if (cpi->gm_info.num_ref_frames[0] || cpi->gm_info.num_ref_frames[1]) {
      gm_alloc_data(cpi, &cpi->td.gm_data);
      if (cpi->mt_info.num_workers > 1)
        av1_global_motion_estimation_mt(cpi);
      else
        global_motion_estimation(cpi);
      gm_dealloc_data(&cpi->td.gm_data);
      gm_info->search_done = 1;
    }
  }
  memcpy(cm->cur_frame->global_motion, cm->global_motion,
         sizeof(cm->cur_frame->global_motion));
}